

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O3

SUNErrCode SUNDataNode_GetChild_InMem(SUNDataNode self,sundataindex index,SUNDataNode *child_node)

{
  long *plVar1;
  SUNErrCode SVar2;
  long lVar3;
  
  plVar1 = *(long **)((long)self->content + 0x30);
  if ((plVar1 == (long *)0x0) || (lVar3 = *plVar1, lVar3 == 0)) {
    if (*(long *)((long)self->content + 0x28) == 0) {
      return -0x26ff;
    }
    lVar3 = *plVar1;
  }
  SVar2 = -0x26ff;
  if (((-1 < index) && (index < lVar3)) && (plVar1[2] != 0)) {
    *child_node = *(SUNDataNode *)(plVar1[2] + index * 8);
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SUNErrCode SUNDataNode_HasChildren_InMem(const SUNDataNode self,
                                         sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);
  *yes_or_no =
    (IMPL_MEMBER(self, anon_children) &&
     SUNStlVector_SUNDataNode_Size(IMPL_MEMBER(self, anon_children)) != 0) ||
    IMPL_MEMBER(self, num_named_children) != 0;
  return SUN_SUCCESS;
}